

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O0

void yin_print_list(lyout *out,int level,lys_node *node)

{
  int iVar1;
  bool bVar2;
  lys_node_list *list;
  lys_node *sub;
  int content2;
  int content;
  int p;
  int i;
  lys_node *node_local;
  lyout *plStack_10;
  int level_local;
  lyout *out_local;
  
  sub._4_4_ = 0;
  _p = node;
  node_local._4_4_ = level;
  plStack_10 = out;
  yin_print_open(out,level,(char *)0x0,"list","name",node->name,0);
  node_local._4_4_ = node_local._4_4_ + 1;
  yin_print_snode_common(plStack_10,node_local._4_4_,_p,_p->module,(int *)((long)&sub + 4),1);
  if (node[1].name != (char *)0x0) {
    yin_print_close_parent(plStack_10,(int *)((long)&sub + 4));
    yin_print_when(plStack_10,node_local._4_4_,node->module,(lys_when *)node[1].name);
  }
  for (content = 0; content < (int)(uint)node->iffeature_size; content = content + 1) {
    yin_print_close_parent(plStack_10,(int *)((long)&sub + 4));
    yin_print_iffeature(plStack_10,node_local._4_4_,_p->module,node->iffeature + content);
  }
  for (content = 0; content < (int)(uint)node->padding[0]; content = content + 1) {
    yin_print_close_parent(plStack_10,(int *)((long)&sub + 4));
    yin_print_must(plStack_10,node_local._4_4_,node->module,
                   (lys_restr *)(node[1].dsc + (long)content * 0x38));
  }
  if (node->padding[2] != '\0') {
    yin_print_close_parent(plStack_10,(int *)((long)&sub + 4));
    yin_print_substmt(plStack_10,node_local._4_4_,LYEXT_SUBSTMT_KEY,'\0',(char *)node[1].module,
                      _p->module,_p->ext,(uint)_p->ext_size);
  }
  for (content = 0; content < (int)(uint)node->padding[3]; content = content + 1) {
    yin_print_close_parent(plStack_10,(int *)((long)&sub + 4));
    yin_print_unique(plStack_10,node_local._4_4_,_p->module,
                     (lys_unique *)(node[1].ext + (long)content * 2));
    sub._0_4_ = 0;
    content2 = -1;
    do {
      content2 = lys_ext_iter(node->ext,node->ext_size,(char)content2 + '\x01',LYEXT_SUBSTMT_UNIQUE)
      ;
      bVar2 = false;
      if (content2 != -1) {
        bVar2 = (uint)node->ext[content2]->insubstmt_index != content;
      }
    } while (bVar2);
    if (content2 != -1) {
      yin_print_close_parent(plStack_10,(int *)&sub);
      do {
        yin_print_extension_instances
                  (plStack_10,node_local._4_4_ + 1,node->module,LYEXT_SUBSTMT_UNIQUE,
                   (uint8_t)content,node->ext + content2,1);
        do {
          content2 = lys_ext_iter(node->ext,node->ext_size,(char)content2 + '\x01',
                                  LYEXT_SUBSTMT_UNIQUE);
          bVar2 = false;
          if (content2 != -1) {
            bVar2 = (uint)node->ext[content2]->insubstmt_index != content;
          }
        } while (bVar2);
      } while (content2 != -1);
      content2 = -1;
    }
    yin_print_close(plStack_10,node_local._4_4_,(char *)0x0,"unique",(int)sub);
  }
  yin_print_snode_common(plStack_10,node_local._4_4_,_p,_p->module,(int *)((long)&sub + 4),4);
  if (*(int *)&node[1].iffeature != 0) {
    yin_print_close_parent(plStack_10,(int *)((long)&sub + 4));
    yin_print_unsigned(plStack_10,node_local._4_4_,LYEXT_SUBSTMT_MIN,'\0',_p->module,_p->ext,
                       (uint)_p->ext_size,*(uint *)&node[1].iffeature);
  }
  if (*(int *)((long)&node[1].iffeature + 4) != 0) {
    yin_print_close_parent(plStack_10,(int *)((long)&sub + 4));
    yin_print_unsigned(plStack_10,node_local._4_4_,LYEXT_SUBSTMT_MAX,'\0',_p->module,_p->ext,
                       (uint)_p->ext_size,*(uint *)((long)&node[1].iffeature + 4));
  }
  if ((node->flags & 0x100) == 0) {
    iVar1 = lys_ext_iter(_p->ext,_p->ext_size,'\0',LYEXT_SUBSTMT_ORDEREDBY);
    if (iVar1 != -1) {
      yin_print_close_parent(plStack_10,(int *)((long)&sub + 4));
      yin_print_substmt(plStack_10,node_local._4_4_,LYEXT_SUBSTMT_ORDEREDBY,'\0',"system",_p->module
                        ,_p->ext,(uint)_p->ext_size);
    }
  }
  else {
    yin_print_close_parent(plStack_10,(int *)((long)&sub + 4));
    yin_print_substmt(plStack_10,node_local._4_4_,LYEXT_SUBSTMT_ORDEREDBY,'\0',"user",_p->module,
                      _p->ext,(uint)_p->ext_size);
  }
  yin_print_snode_common(plStack_10,node_local._4_4_,_p,_p->module,(int *)((long)&sub + 4),0x70);
  for (content = 0; content < (int)(uint)node->padding[1]; content = content + 1) {
    yin_print_close_parent(plStack_10,(int *)((long)&sub + 4));
    yin_print_typedef(plStack_10,node_local._4_4_,node->module,
                      (lys_tpdf *)(node[1].ref + (long)content * 0x80));
  }
  for (list = (lys_node_list *)_p->child; list != (lys_node_list *)0x0;
      list = (lys_node_list *)list->next) {
    if (list->parent == _p) {
      yin_print_close_parent(plStack_10,(int *)((long)&sub + 4));
      yin_print_snode(plStack_10,node_local._4_4_,(lys_node *)list,0x800);
    }
  }
  for (list = (lys_node_list *)_p->child; list != (lys_node_list *)0x0;
      list = (lys_node_list *)list->next) {
    if (list->parent == _p) {
      yin_print_close_parent(plStack_10,(int *)((long)&sub + 4));
      yin_print_snode(plStack_10,node_local._4_4_,(lys_node *)list,0x903f);
    }
  }
  for (list = (lys_node_list *)_p->child; list != (lys_node_list *)0x0;
      list = (lys_node_list *)list->next) {
    if (list->parent == _p) {
      yin_print_close_parent(plStack_10,(int *)((long)&sub + 4));
      yin_print_snode(plStack_10,node_local._4_4_,(lys_node *)list,0x4000);
    }
  }
  for (list = (lys_node_list *)_p->child; list != (lys_node_list *)0x0;
      list = (lys_node_list *)list->next) {
    if (list->parent == _p) {
      yin_print_close_parent(plStack_10,(int *)((long)&sub + 4));
      yin_print_snode(plStack_10,node_local._4_4_,(lys_node *)list,0x80);
    }
  }
  node_local._4_4_ = node_local._4_4_ + -1;
  yin_print_close(plStack_10,node_local._4_4_,(char *)0x0,"list",sub._4_4_);
  return;
}

Assistant:

static void
yin_print_list(struct lyout *out, int level, const struct lys_node *node)
{
    int i, p, content = 0, content2;
    struct lys_node *sub;
    struct lys_node_list *list = (struct lys_node_list *)node;

    yin_print_open(out, level, NULL, "list", "name", node->name, content);
    level++;

    yin_print_snode_common(out, level, node, node->module, &content, SNODE_COMMON_EXT);
    if (list->when) {
        yin_print_close_parent(out, &content);
        yin_print_when(out, level, list->module, list->when);
    }
    for (i = 0; i < list->iffeature_size; i++) {
        yin_print_close_parent(out, &content);
        yin_print_iffeature(out, level, node->module, &list->iffeature[i]);
    }
    for (i = 0; i < list->must_size; i++) {
        yin_print_close_parent(out, &content);
        yin_print_must(out, level, list->module, &list->must[i]);
    }
    if (list->keys_size) {
        yin_print_close_parent(out, &content);
        yin_print_substmt(out, level, LYEXT_SUBSTMT_KEY, 0, list->keys_str,
                          node->module, node->ext, node->ext_size);
    }
    for (i = 0; i < list->unique_size; i++) {
        yin_print_close_parent(out, &content);
        yin_print_unique(out, level, node->module, &list->unique[i]);
        content2 = 0;
        /* unique's extensions */
        p = -1;
        do {
            p = lys_ext_iter(list->ext, list->ext_size, p + 1, LYEXT_SUBSTMT_UNIQUE);
        } while (p != -1 && list->ext[p]->insubstmt_index != i);
        if (p != -1) {
            yin_print_close_parent(out, &content2);
            do {
                yin_print_extension_instances(out, level + 1, list->module, LYEXT_SUBSTMT_UNIQUE, i, &list->ext[p], 1);
                do {
                    p = lys_ext_iter(list->ext, list->ext_size, p + 1, LYEXT_SUBSTMT_UNIQUE);
                } while (p != -1 && list->ext[p]->insubstmt_index != i);
            } while (p != -1);
        }
        yin_print_close(out, level, NULL, "unique", content2);
    }
    yin_print_snode_common(out, level, node, node->module, &content, SNODE_COMMON_CONFIG);
    if (list->min > 0) {
        yin_print_close_parent(out, &content);
        yin_print_unsigned(out, level, LYEXT_SUBSTMT_MIN, 0, node->module, node->ext, node->ext_size, list->min);
    }
    if (list->max > 0) {
        yin_print_close_parent(out, &content);
        yin_print_unsigned(out, level, LYEXT_SUBSTMT_MAX, 0, node->module, node->ext, node->ext_size, list->max);
    }
    if (list->flags & LYS_USERORDERED) {
        yin_print_close_parent(out, &content);
        yin_print_substmt(out, level, LYEXT_SUBSTMT_ORDEREDBY, 0, "user",
                          node->module, node->ext, node->ext_size);
    } else if (lys_ext_iter(node->ext, node->ext_size, 0, LYEXT_SUBSTMT_ORDEREDBY) != -1) {
        yin_print_close_parent(out, &content);
        yin_print_substmt(out, level, LYEXT_SUBSTMT_ORDEREDBY, 0, "system",
                          node->module, node->ext, node->ext_size);
    }
    yin_print_snode_common(out, level, node, node->module, &content,
                           SNODE_COMMON_STATUS | SNODE_COMMON_DSC | SNODE_COMMON_REF);
    for (i = 0; i < list->tpdf_size; i++) {
        yin_print_close_parent(out, &content);
        yin_print_typedef(out, level, list->module, &list->tpdf[i]);
    }

    LY_TREE_FOR(node->child, sub) {
        /* augments */
        if (sub->parent != node) {
            continue;
        }
        yin_print_close_parent(out, &content);
        yin_print_snode(out, level, sub, LYS_GROUPING);
    }

    LY_TREE_FOR(node->child, sub) {
        /* augments */
        if (sub->parent != node) {
            continue;
        }
        yin_print_close_parent(out, &content);
        yin_print_snode(out, level, sub, LYS_CHOICE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST |
                        LYS_USES | LYS_ANYDATA);
    }

    LY_TREE_FOR(node->child, sub) {
        /* augments */
        if (sub->parent != node) {
            continue;
        }
        yin_print_close_parent(out, &content);
        yin_print_snode(out, level, sub, LYS_ACTION);
    }

    LY_TREE_FOR(node->child, sub) {
        /* augments */
        if (sub->parent != node) {
            continue;
        }
        yin_print_close_parent(out, &content);
        yin_print_snode(out, level, sub, LYS_NOTIF);
    }

    level--;
    yin_print_close(out, level, NULL, "list", content);
}